

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O3

REF_STATUS
ref_node_tri_dquality_dnode0(REF_NODE ref_node,REF_INT *nodes,REF_DBL *quality,REF_DBL *d_quality)

{
  int iVar1;
  uint uVar2;
  REF_DBL *pRVar3;
  REF_DBL *pRVar4;
  undefined8 uVar5;
  long lVar6;
  long lVar7;
  char *pcVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  undefined1 auVar15 [16];
  double dVar16;
  double dVar17;
  double dVar18;
  REF_DBL det;
  REF_DBL area;
  REF_DBL l2;
  REF_DBL jac [9];
  REF_DBL e2 [3];
  REF_DBL e1 [3];
  REF_DBL e0 [3];
  REF_DBL d_area [3];
  REF_DBL d_area_in_metric [3];
  REF_DBL da [3];
  REF_DBL l1;
  REF_DBL l0;
  REF_DBL d_l1 [3];
  REF_DBL d_l0 [3];
  REF_DBL d_denom [3];
  double local_388 [4];
  double local_368;
  double local_348 [4];
  double local_328 [4];
  REF_DBL local_308 [3];
  double dStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  double local_2b8 [4];
  double local_298 [4];
  double local_278 [6];
  REF_DBL local_248 [3];
  double adStack_230 [7];
  REF_DBL local_1f8 [3];
  double adStack_1e0 [7];
  double adStack_1a8 [6];
  double adStack_178 [4];
  double adStack_158 [4];
  double adStack_138 [4];
  double local_118 [6];
  double local_e8 [6];
  REF_DBL local_b8;
  double local_b0 [5];
  REF_DBL local_88 [6];
  double adStack_58 [6];
  
  if (ref_node->tri_quality == 2) {
    iVar1 = *nodes;
    pRVar3 = ref_node->real;
    lVar6 = 0;
    do {
      *(REF_DBL *)((long)local_88 + (lVar6 + 5) * 8 + 8U) = pRVar3[iVar1 * 0xf + 9 + (int)lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 6);
    iVar1 = nodes[1];
    lVar6 = 0;
    do {
      (&local_b8)[lVar6 + 6] = pRVar3[iVar1 * 0xf + 9 + (int)lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 6);
    iVar1 = nodes[2];
    lVar6 = 0;
    do {
      (&local_b8)[lVar6] = pRVar3[iVar1 * 0xf + 9 + (int)lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 6);
    lVar6 = 0;
    do {
      auVar12._0_8_ =
           *(double *)((long)local_88 + (lVar6 + 5) * 8 + 8U) + (&local_b8)[lVar6 + 6] +
           (&local_b8)[lVar6];
      auVar12._8_8_ =
           *(double *)((long)local_88 + (lVar6 + 6U) * 8 + 8U) + (&local_b8)[lVar6 + 7] +
           (&local_b8)[lVar6 + 1];
      auVar12 = divpd(auVar12,_DAT_00202e90);
      *(undefined1 (*) [16])(local_e8 + lVar6) = auVar12;
      lVar6 = lVar6 + 2;
    } while (lVar6 != 6);
    uVar2 = ref_matrix_exp_m(local_e8,local_118);
    if (uVar2 == 0) {
      uVar2 = ref_matrix_jacob_m(local_118,local_308);
      if (uVar2 == 0) {
        uVar2 = ref_matrix_vect_mult(local_308,ref_node->real + (long)*nodes * 0xf,local_328);
        if (uVar2 == 0) {
          uVar2 = ref_matrix_vect_mult(local_308,ref_node->real + (long)nodes[1] * 0xf,local_388);
          if (uVar2 == 0) {
            uVar2 = ref_matrix_vect_mult(local_308,ref_node->real + (long)nodes[2] * 0xf,local_348);
            if (uVar2 == 0) {
              local_1f8[0] = local_308[0];
              local_1f8[1] = local_308[1];
              local_1f8[2] = local_308[2];
              adStack_1e0[0] = dStack_2f0;
              adStack_1e0[1] = (double)local_2e8;
              adStack_1e0[2] = (double)uStack_2e0;
              adStack_1e0[3] = (double)local_2d8;
              adStack_1e0[4] = (double)uStack_2d0;
              adStack_1e0[5] = (double)local_2c8;
              lVar6 = 0;
              do {
                local_278[lVar6] = local_348[lVar6] - local_388[lVar6];
                lVar6 = lVar6 + 1;
              } while (lVar6 != 3);
              lVar6 = 0;
              do {
                local_298[lVar6] = local_328[lVar6] - local_348[lVar6];
                lVar6 = lVar6 + 1;
              } while (lVar6 != 3);
              lVar6 = 0;
              do {
                local_2b8[lVar6] = local_388[lVar6] - local_328[lVar6];
                lVar6 = lVar6 + 1;
              } while (lVar6 != 3);
              pRVar3 = local_248;
              pRVar4 = local_1f8;
              lVar6 = 0;
              do {
                lVar7 = 0;
                do {
                  pRVar3[lVar7] = -pRVar4[lVar7];
                  lVar7 = lVar7 + 1;
                } while (lVar7 != 3);
                lVar6 = lVar6 + 1;
                pRVar3 = pRVar3 + 3;
                pRVar4 = pRVar4 + 3;
              } while (lVar6 != 3);
              lVar6 = 0;
              do {
                dVar17 = local_248[lVar6];
                dVar16 = adStack_230[lVar6];
                dVar14 = adStack_230[lVar6 + 3];
                adStack_1a8[lVar6] = dVar16 * local_278[2] - local_278[1] * dVar14;
                adStack_1a8[lVar6 + 3] = dVar14 * local_278[0] - local_278[2] * dVar17;
                adStack_1a8[lVar6 + 6] = dVar17 * local_278[1] - local_278[0] * dVar16;
                lVar6 = lVar6 + 1;
              } while (lVar6 != 3);
              lVar6 = 0;
              do {
                adStack_158[lVar6] =
                     adStack_230[lVar6 + 3] * (local_2b8[2] + local_2b8[2]) +
                     adStack_230[lVar6] * (local_2b8[1] + local_2b8[1]) +
                     local_248[lVar6] * (local_2b8[0] + local_2b8[0]) +
                     adStack_1e0[lVar6 + 3] * (local_298[2] + local_298[2]) +
                     local_1f8[lVar6] * (local_298[0] + local_298[0]) +
                     adStack_1e0[lVar6] * (local_298[1] + local_298[1]);
                lVar6 = lVar6 + 1;
              } while (lVar6 != 3);
              dVar18 = local_2b8[2] * local_278[0] + -local_2b8[0] * local_278[2];
              dVar17 = local_2b8[1] * local_278[2] + -local_2b8[2] * local_278[1];
              dVar14 = local_2b8[0] * local_278[1] + -local_2b8[1] * local_278[0];
              dVar16 = SQRT(dVar14 * dVar14 + dVar17 * dVar17 + dVar18 * dVar18);
              lVar6 = 0;
              do {
                adStack_138[lVar6] =
                     (adStack_1a8[lVar6 + 6] * (dVar14 + dVar14) +
                     adStack_1a8[lVar6] * (dVar17 + dVar17) +
                     adStack_1a8[lVar6 + 3] * (dVar18 + dVar18)) * (0.25 / dVar16);
                lVar6 = lVar6 + 1;
              } while (lVar6 != 3);
              dVar17 = local_278[2] * local_278[2] +
                       local_278[0] * local_278[0] + local_278[1] * local_278[1] +
                       local_298[2] * local_298[2] +
                       local_298[0] * local_298[0] + local_298[1] * local_298[1] +
                       local_2b8[2] * local_2b8[2] +
                       local_2b8[0] * local_2b8[0] + local_2b8[1] * local_2b8[1];
              dVar16 = dVar16 * 0.5;
              auVar13._0_8_ = -(dVar17 * 1e+20);
              auVar13._8_8_ = -dVar16;
              auVar15._8_8_ = dVar16;
              auVar15._0_8_ = dVar17 * 1e+20;
              auVar12 = maxpd(auVar15,auVar13);
              if (auVar12._0_8_ <= auVar12._8_8_) {
                *quality = -1.0;
              }
              else {
                *quality = (dVar16 / dVar17) * 6.928203230275509;
                lVar6 = 0;
                do {
                  d_quality[lVar6] =
                       (((adStack_138[lVar6] * dVar17 + adStack_158[lVar6] * auVar13._8_8_) *
                        6.928203230275509) / dVar17) / dVar17;
                  lVar6 = lVar6 + 1;
                } while (lVar6 != 3);
              }
              return 0;
            }
            pcVar8 = "xyz2";
            uVar5 = 0x85f;
          }
          else {
            pcVar8 = "xyz1";
            uVar5 = 0x85d;
          }
        }
        else {
          pcVar8 = "xyz0";
          uVar5 = 0x85b;
        }
      }
      else {
        pcVar8 = "jac";
        uVar5 = 0x858;
      }
    }
    else {
      pcVar8 = "exp";
      uVar5 = 0x857;
    }
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar5,
           "ref_node_tri_jac_dquality_dnode0",(ulong)uVar2,pcVar8);
    uVar5 = 0x8a3;
  }
  else {
    if (ref_node->tri_quality != 1) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x8a6,
             "ref_node_tri_dquality_dnode0","case not recognized");
      return 1;
    }
    uVar2 = ref_node_dratio_dnode0(ref_node,*nodes,nodes[1],local_e8,local_88);
    if (uVar2 == 0) {
      uVar2 = ref_node_dratio_dnode0(ref_node,*nodes,nodes[2],local_118,&local_b8);
      if (uVar2 == 0) {
        uVar2 = ref_node_ratio(ref_node,nodes[1],nodes[2],local_328);
        if (uVar2 == 0) {
          uVar2 = ref_node_tri_darea_dnode0(ref_node,nodes,local_348,local_248);
          if (uVar2 == 0) {
            iVar1 = *nodes;
            pRVar3 = ref_node->real;
            lVar6 = 0;
            do {
              local_308[lVar6] = pRVar3[iVar1 * 0xf + 3 + (int)lVar6];
              lVar6 = lVar6 + 1;
            } while (lVar6 != 6);
            uVar2 = ref_matrix_det_m(local_308,local_388);
            dVar17 = local_388[0];
            if (uVar2 == 0) {
              iVar1 = nodes[1];
              pRVar3 = ref_node->real;
              lVar6 = 0;
              do {
                local_308[lVar6] = pRVar3[iVar1 * 0xf + 3 + (int)lVar6];
                lVar6 = lVar6 + 1;
              } while (lVar6 != 6);
              uVar2 = ref_matrix_det_m(local_308,local_388);
              dVar16 = local_388[0];
              if (uVar2 == 0) {
                iVar1 = nodes[2];
                pRVar3 = ref_node->real;
                lVar6 = 0;
                do {
                  local_308[lVar6] = pRVar3[iVar1 * 0xf + 3 + (int)lVar6];
                  lVar6 = lVar6 + 1;
                } while (lVar6 != 6);
                uVar2 = ref_matrix_det_m(local_308,local_388);
                if (uVar2 == 0) {
                  uVar9 = SUB84(dVar17,0);
                  uVar10 = (undefined4)((ulong)dVar17 >> 0x20);
                  if (dVar16 <= dVar17) {
                    uVar9 = SUB84(dVar16,0);
                    uVar10 = (undefined4)((ulong)dVar16 >> 0x20);
                  }
                  if (local_388[0] <= (double)CONCAT44(uVar10,uVar9)) {
                    uVar9 = SUB84(local_388[0],0);
                    uVar10 = (undefined4)((ulong)local_388[0] >> 0x20);
                  }
                  dVar17 = pow((double)CONCAT44(uVar10,uVar9),0.3333333333333333);
                  lVar6 = 0;
                  local_368 = local_348[0];
                  do {
                    dVar16 = pow((double)CONCAT44(uVar10,uVar9),0.3333333333333333);
                    adStack_1a8[lVar6] = dVar16 * local_248[lVar6];
                    lVar6 = lVar6 + 1;
                  } while (lVar6 != 3);
                  lVar6 = 0;
                  do {
                    *(double *)((long)local_88 + (lVar6 + 5) * 8 + 8U) =
                         (&local_b8)[lVar6 + 6] * (local_e8[0] + local_e8[0]) +
                         (&local_b8)[lVar6] * (local_118[0] + local_118[0]);
                    lVar6 = lVar6 + 1;
                  } while (lVar6 != 3);
                  dVar17 = dVar17 * local_368;
                  dVar16 = local_328[0] * local_328[0] +
                           local_e8[0] * local_e8[0] + local_118[0] * local_118[0];
                  dVar14 = dVar16 * 1e+20;
                  if (dVar14 <= -dVar14) {
                    dVar14 = -dVar14;
                  }
                  dVar11 = -dVar17;
                  dVar18 = dVar17;
                  if (dVar17 <= dVar11) {
                    dVar18 = dVar11;
                  }
                  if (dVar18 < dVar14) {
                    *quality = (dVar17 * 6.9282032302755105) / dVar16;
                    lVar6 = 0;
                    do {
                      d_quality[lVar6] =
                           (((adStack_1a8[lVar6] * dVar16 +
                             *(double *)((long)local_88 + (lVar6 + 5) * 8 + 8U) * dVar11) *
                            6.9282032302755105) / dVar16) / dVar16;
                      lVar6 = lVar6 + 1;
                    } while (lVar6 != 3);
                    return 0;
                  }
                  *quality = -1.0;
                  *d_quality = 0.0;
                  d_quality[1] = 0.0;
                  d_quality[2] = 0.0;
                  return 0;
                }
                pcVar8 = "n2";
                uVar5 = 0x82b;
              }
              else {
                pcVar8 = "n1";
                uVar5 = 0x827;
              }
            }
            else {
              pcVar8 = "n0";
              uVar5 = 0x823;
            }
          }
          else {
            pcVar8 = "area";
            uVar5 = 0x820;
          }
        }
        else {
          pcVar8 = "l2";
          uVar5 = 0x81e;
        }
      }
      else {
        pcVar8 = "l1";
        uVar5 = 0x81d;
      }
    }
    else {
      pcVar8 = "l0";
      uVar5 = 0x81c;
    }
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar5,
           "ref_node_tri_epic_dquality_dnode0",(ulong)uVar2,pcVar8);
    uVar5 = 0x89f;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar5,
         "ref_node_tri_dquality_dnode0",(ulong)uVar2,"epic");
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_node_tri_dquality_dnode0(REF_NODE ref_node,
                                                REF_INT *nodes,
                                                REF_DBL *quality,
                                                REF_DBL *d_quality) {
  switch (ref_node->tri_quality) {
    case REF_NODE_EPIC_QUALITY:
      RSS(ref_node_tri_epic_dquality_dnode0(ref_node, nodes, quality,
                                            d_quality),
          "epic");
      break;
    case REF_NODE_JAC_QUALITY:
      RSS(ref_node_tri_jac_dquality_dnode0(ref_node, nodes, quality, d_quality),
          "epic");
      break;
    default:
      THROW("case not recognized");
  }
  return REF_SUCCESS;
}